

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_chunk_append(uchar **out,size_t *outlength,uchar *chunk)

{
  uint uVar1;
  ulong new_size;
  uchar *puVar2;
  size_t new_length;
  uchar *new_buffer;
  uchar *chunk_start;
  uint total_chunk_length;
  uint i;
  uchar *chunk_local;
  size_t *outlength_local;
  uchar **out_local;
  
  uVar1 = lodepng_chunk_length(chunk);
  uVar1 = uVar1 + 0xc;
  new_size = *outlength + (ulong)uVar1;
  if ((new_size < uVar1) || (new_size < *outlength)) {
    out_local._4_4_ = 0x4d;
  }
  else {
    puVar2 = (uchar *)lodepng_realloc(*out,new_size);
    if (puVar2 == (uchar *)0x0) {
      out_local._4_4_ = 0x53;
    }
    else {
      *out = puVar2;
      *outlength = new_size;
      puVar2 = *out;
      for (chunk_start._4_4_ = 0; chunk_start._4_4_ != uVar1;
          chunk_start._4_4_ = chunk_start._4_4_ + 1) {
        puVar2[(ulong)chunk_start._4_4_ + (new_size - uVar1)] = chunk[chunk_start._4_4_];
      }
      out_local._4_4_ = 0;
    }
  }
  return out_local._4_4_;
}

Assistant:

unsigned lodepng_chunk_append(unsigned char** out, size_t* outlength, const unsigned char* chunk)
{
  unsigned i;
  unsigned total_chunk_length = lodepng_chunk_length(chunk) + 12;
  unsigned char *chunk_start, *new_buffer;
  size_t new_length = (*outlength) + total_chunk_length;
  if(new_length < total_chunk_length || new_length < (*outlength)) return 77; /*integer overflow happened*/

  new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
  if(!new_buffer) return 83; /*alloc fail*/
  (*out) = new_buffer;
  (*outlength) = new_length;
  chunk_start = &(*out)[new_length - total_chunk_length];

  for(i = 0; i != total_chunk_length; ++i) chunk_start[i] = chunk[i];

  return 0;
}